

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_bzip2.c
# Opt level: O1

int drive_compressor(archive_write_filter *f,private_data_conflict8 *data,int finishing,void *src,
                    size_t length)

{
  ZSTD_outBuffer *output;
  archive *a;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  int unaff_R12D;
  ZSTD_inBuffer in;
  ZSTD_inBuffer local_48;
  
  local_48.pos = 0;
  output = &data->out;
  local_48.src = src;
  local_48.size = length;
  do {
    sVar4 = (data->out).size;
    if ((data->out).pos == sVar4) {
      iVar2 = __archive_write_filter(f->next_filter,output->dst,sVar4);
      if (iVar2 != 0) {
        return -0x1e;
      }
      (data->out).pos = 0;
    }
    if (finishing == 0) {
      if (local_48.pos == local_48.size) {
        return 0;
      }
      sVar4 = ZSTD_compressStream(data->cstream,output,&local_48);
    }
    else {
      sVar4 = ZSTD_endStream(data->cstream,output);
    }
    uVar3 = ZSTD_isError(sVar4);
    if (uVar3 == 0) {
      bVar1 = true;
      if ((finishing != 0) && (sVar4 == 0)) {
        unaff_R12D = __archive_write_filter(f->next_filter,(data->out).dst,(data->out).pos);
        bVar1 = false;
      }
    }
    else {
      a = f->archive;
      pcVar5 = ZSTD_getErrorName(sVar4);
      bVar1 = false;
      archive_set_error(a,-1,"Zstd compression failed: %s",pcVar5);
      unaff_R12D = -0x1e;
    }
  } while (bVar1);
  return unaff_R12D;
}

Assistant:

static int
drive_compressor(struct archive_write_filter *f,
    struct private_data *data, int finishing)
{
	int ret;

	for (;;) {
		if (data->stream.avail_out == 0) {
			ret = __archive_write_filter(f->next_filter,
			    data->compressed,
			    data->compressed_buffer_size);
			if (ret != ARCHIVE_OK) {
				/* TODO: Handle this write failure */
				return (ARCHIVE_FATAL);
			}
			data->stream.next_out = data->compressed;
			data->stream.avail_out = data->compressed_buffer_size;
		}

		/* If there's nothing to do, we're done. */
		if (!finishing && data->stream.avail_in == 0)
			return (ARCHIVE_OK);

		ret = BZ2_bzCompress(&(data->stream),
		    finishing ? BZ_FINISH : BZ_RUN);

		switch (ret) {
		case BZ_RUN_OK:
			/* In non-finishing case, did compressor
			 * consume everything? */
			if (!finishing && data->stream.avail_in == 0)
				return (ARCHIVE_OK);
			break;
		case BZ_FINISH_OK:  /* Finishing: There's more work to do */
			break;
		case BZ_STREAM_END: /* Finishing: all done */
			/* Only occurs in finishing case */
			return (ARCHIVE_OK);
		default:
			/* Any other return value indicates an error */
			archive_set_error(f->archive,
			    ARCHIVE_ERRNO_PROGRAMMER,
			    "Bzip2 compression failed;"
			    " BZ2_bzCompress() returned %d",
			    ret);
			return (ARCHIVE_FATAL);
		}
	}
}